

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

MemoryRegionSection *
section_from_flat_range(MemoryRegionSection *__return_storage_ptr__,FlatRange *fr,FlatView *fv)

{
  undefined1 a [16];
  Int128 IVar1;
  uint64_t uVar2;
  MemoryRegionSection *pMVar3;
  FlatView *fv_local;
  FlatRange *fr_local;
  
  IVar1 = (fr->addr).size;
  *(undefined8 *)((long)&__return_storage_ptr__->size + 8) =
       *(undefined8 *)((long)&(fr->addr).size + 8);
  *(long *)&__return_storage_ptr__->size = (long)IVar1;
  __return_storage_ptr__->mr = fr->mr;
  __return_storage_ptr__->fv = fv;
  __return_storage_ptr__->offset_within_region = fr->offset_in_region;
  a._8_8_ = __return_storage_ptr__;
  a._0_8_ = __return_storage_ptr__;
  pMVar3 = __return_storage_ptr__;
  uVar2 = int128_get64((Int128)a);
  __return_storage_ptr__->offset_within_address_space = uVar2;
  __return_storage_ptr__->readonly = (_Bool)(fr->readonly & 1);
  return pMVar3;
}

Assistant:

static inline MemoryRegionSection
section_from_flat_range(FlatRange *fr, FlatView *fv)
{
    return (MemoryRegionSection) {
        .mr = fr->mr,
        .fv = fv,
        .offset_within_region = fr->offset_in_region,
        .size = fr->addr.size,
        .offset_within_address_space = int128_get64(fr->addr.start),
        .readonly = fr->readonly,
    };
}